

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O3

void helper_msa_ffint_u_df_mips64(CPUMIPSState_conflict5 *env,uint32_t df,uint32_t wd,uint32_t ws)

{
  int32_t *piVar1;
  float_status *pfVar2;
  fpr_t *pfVar3;
  byte bVar4;
  long lVar5;
  bool bVar6;
  uint uVar7;
  uint uVar8;
  float32 fVar9;
  float64 fVar10;
  long lVar11;
  uint uVar12;
  bool bVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  float64 *pfVar17;
  float_status *status;
  uint32_t unaff_retaddr;
  wr_t wx;
  float64 local_48;
  float64 afStack_40 [2];
  
  lVar5 = (ulong)ws * 0x10 + 0x338;
  piVar1 = &(env->active_tc).msacsr;
  *piVar1 = *piVar1 & 0xfffc0fff;
  if (df == 2) {
    pfVar2 = &(env->active_tc).msa_fp_status;
    lVar11 = 0;
    do {
      (env->active_tc).msa_fp_status.float_exception_flags = '\0';
      fVar9 = uint32_to_float32_mips64
                        (*(uint32_t *)((long)(env->active_fpu).fpr + lVar11 * 4 + lVar5 + -0x338),
                         pfVar2);
      *(float32 *)((long)afStack_40 + lVar11 * 4 + -8) = fVar9;
      if ((fVar9 & 0x7fffffff) == 0) {
        uVar16 = (uint)(env->active_tc).msa_fp_status.float_exception_flags;
      }
      else {
        bVar4 = (env->active_tc).msa_fp_status.float_exception_flags;
        uVar16 = (uint)bVar4;
        if ((fVar9 & 0x7f800000) == 0) {
          uVar16 = bVar4 | 0x10;
        }
      }
      uVar7 = ieee_ex_to_mips_mips64(uVar16);
      uVar12 = (env->active_tc).msacsr;
      uVar15 = (uVar12 & 0x1000000) >> 0x18 & uVar16 >> 6;
      uVar14 = 3;
      if ((uVar12 & 0x1000000) == 0) {
        uVar14 = uVar15;
      }
      if (uVar16 < 0x80) {
        uVar14 = uVar15;
      }
      uVar14 = uVar14 | uVar7;
      uVar15 = (uint)((uVar12 >> 9 & 1) == 0 & (byte)uVar7 >> 2);
      uVar8 = uVar15 | uVar14;
      uVar16 = uVar7 & 0xfffffffc;
      if ((uVar15 != 0 || (uVar14 & 1) != 0) || (uVar12 & 0x100) != 0) {
        uVar16 = uVar8;
      }
      if ((uVar14 & 2) == 0) {
        uVar16 = uVar8;
      }
      if ((uVar16 & (uVar12 >> 7 & 0x1f | 0x20)) == 0) {
        uVar14 = uVar16 << 0xc;
LAB_008c4a3b:
        (env->active_tc).msacsr = uVar14 & 0x3f000 | uVar12;
        if (((uVar12 >> 7 & 0x1f | 0x20) & uVar16) != 0) goto LAB_008c4a56;
      }
      else {
        if ((uVar12 >> 0x12 & 1) == 0) {
          uVar14 = uVar16 << 0xc | uVar12;
          uVar12 = uVar12 & 0xfff80fff;
          goto LAB_008c4a3b;
        }
LAB_008c4a56:
        fVar9 = float32_default_nan_mips64(pfVar2);
        *(float32 *)((long)afStack_40 + lVar11 * 4 + -8) = fVar9 & 0xffffffc0 ^ 0x400000 | uVar16;
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != 4);
  }
  else {
    if (df != 3) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/mips/msa_helper.c"
                    ,0x1cf5,
                    "void helper_msa_ffint_u_df_mips64(CPUMIPSState *, uint32_t, uint32_t, uint32_t)"
                   );
    }
    pfVar2 = &(env->active_tc).msa_fp_status;
    pfVar17 = &local_48;
    lVar11 = 0;
    bVar6 = true;
    do {
      bVar13 = bVar6;
      (env->active_tc).msa_fp_status.float_exception_flags = '\0';
      fVar10 = uint64_to_float64_mips64
                         (*(uint64_t *)((long)(env->active_fpu).fpr + lVar11 * 8 + lVar5 + -0x338),
                          pfVar2);
      *pfVar17 = fVar10;
      if ((fVar10 & 0x7fffffffffffffff) == 0) {
        uVar16 = (uint)(env->active_tc).msa_fp_status.float_exception_flags;
      }
      else {
        bVar4 = (env->active_tc).msa_fp_status.float_exception_flags;
        uVar16 = (uint)bVar4;
        if ((fVar10 & 0x7ff0000000000000) == 0) {
          uVar16 = bVar4 | 0x10;
        }
      }
      uVar7 = ieee_ex_to_mips_mips64(uVar16);
      uVar12 = (env->active_tc).msacsr;
      uVar15 = (uVar12 & 0x1000000) >> 0x18 & uVar16 >> 6;
      uVar14 = 3;
      if ((uVar12 & 0x1000000) == 0) {
        uVar14 = uVar15;
      }
      if (uVar16 < 0x80) {
        uVar14 = uVar15;
      }
      uVar14 = uVar14 | uVar7;
      uVar15 = (uint)((uVar12 >> 9 & 1) == 0 & (byte)uVar7 >> 2);
      uVar8 = uVar15 | uVar14;
      uVar16 = uVar7 & 0xfffffffc;
      if ((uVar15 != 0 || (uVar14 & 1) != 0) || (uVar12 & 0x100) != 0) {
        uVar16 = uVar8;
      }
      if ((uVar14 & 2) == 0) {
        uVar16 = uVar8;
      }
      if ((uVar16 & (uVar12 >> 7 & 0x1f | 0x20)) == 0) {
        uVar14 = uVar16 << 0xc;
LAB_008c48f9:
        (env->active_tc).msacsr = uVar14 & 0x3f000 | uVar12;
        if (((uVar12 >> 7 & 0x1f | 0x20) & uVar16) != 0) goto LAB_008c4914;
      }
      else {
        if ((uVar12 >> 0x12 & 1) == 0) {
          uVar14 = uVar16 << 0xc | uVar12;
          uVar12 = uVar12 & 0xfff80fff;
          goto LAB_008c48f9;
        }
LAB_008c4914:
        fVar10 = float64_default_nan_mips64(pfVar2);
        *pfVar17 = (long)(int)uVar16 | fVar10 & 0xffffffffffffffc0 ^ 0x8000000000000;
      }
      lVar11 = 1;
      pfVar17 = afStack_40;
      bVar6 = false;
    } while (bVar13);
  }
  uVar16 = (env->active_tc).msacsr;
  uVar12 = uVar16 >> 7 & 0x1f | 0x20;
  if ((uVar12 & uVar16 >> 0xc) != 0) {
    do_raise_exception(env,unaff_retaddr,(ulong)uVar12);
  }
  (env->active_tc).msacsr = (uVar16 >> 0xc & 0x1f) << 2 | uVar16;
  pfVar3 = (env->active_fpu).fpr + wd;
  pfVar3->fd = local_48;
  (&pfVar3->fd)[1] = afStack_40[0];
  return;
}

Assistant:

void helper_msa_ffint_u_df(CPUMIPSState *env, uint32_t df, uint32_t wd,
                           uint32_t ws)
{
    wr_t wx, *pwx = &wx;
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    uint32_t i;

    clear_msacsr_cause(env);

    switch (df) {
    case DF_WORD:
        for (i = 0; i < DF_ELEMENTS(DF_WORD); i++) {
            MSA_FLOAT_UNOP(pwx->w[i], from_uint32, pws->w[i], 32);
        }
        break;
    case DF_DOUBLE:
        for (i = 0; i < DF_ELEMENTS(DF_DOUBLE); i++) {
            MSA_FLOAT_UNOP(pwx->d[i], from_uint64, pws->d[i], 64);
        }
        break;
    default:
        assert(0);
    }

    check_msacsr_cause(env, GETPC());

    msa_move_v(pwd, pwx);
}